

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  uint err;
  Curl_easy *pCVar1;
  Curl_handler *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  int iVar9;
  uint *puVar10;
  char *pcVar11;
  char *fmt;
  curl_socklen_t slen;
  curl_socklen_t plen;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  socklen_t local_230;
  socklen_t local_22c;
  sockaddr local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  sockaddr local_1a8 [8];
  char local_128 [264];
  
  if ((conn->transport == TRNSPRT_TCP) && ((*(uint *)&(conn->bits).field_0x4 & 0x4000040) == 0)) {
    pCVar1 = conn->data;
    local_22c = 0x80;
    iVar9 = getpeername(sockfd,local_1a8,&local_22c);
    if (iVar9 == 0) {
      local_230 = 0x80;
      local_228.sa_family = 0;
      local_228.sa_data[0] = '\0';
      local_228.sa_data[1] = '\0';
      local_228.sa_data[2] = '\0';
      local_228.sa_data[3] = '\0';
      local_228.sa_data[4] = '\0';
      local_228.sa_data[5] = '\0';
      local_228.sa_data[6] = '\0';
      local_228.sa_data[7] = '\0';
      local_228.sa_data[8] = '\0';
      local_228.sa_data[9] = '\0';
      local_228.sa_data[10] = '\0';
      local_228.sa_data[0xb] = '\0';
      local_228.sa_data[0xc] = '\0';
      local_228.sa_data[0xd] = '\0';
      local_218 = 0;
      uStack_210 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1b8 = 0;
      uStack_1b0 = 0;
      iVar9 = getsockname(sockfd,&local_228,&local_230);
      if (iVar9 == 0) {
        _Var8 = Curl_addr2string((sockaddr *)local_1a8,local_22c,conn->primary_ip,
                                 &conn->primary_port);
        if (_Var8) {
          uVar3 = *(undefined8 *)conn->primary_ip;
          uVar4 = *(undefined8 *)(conn->primary_ip + 8);
          uVar5 = *(undefined8 *)(conn->primary_ip + 0x10);
          uVar6 = *(undefined8 *)(conn->primary_ip + 0x18);
          uVar7 = *(undefined8 *)(conn->primary_ip + 0x26);
          *(undefined8 *)(conn->ip_addr_str + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
          *(undefined8 *)(conn->ip_addr_str + 0x26) = uVar7;
          *(undefined8 *)(conn->ip_addr_str + 0x10) = uVar5;
          *(undefined8 *)(conn->ip_addr_str + 0x18) = uVar6;
          *(undefined8 *)conn->ip_addr_str = uVar3;
          *(undefined8 *)(conn->ip_addr_str + 8) = uVar4;
          _Var8 = Curl_addr2string((sockaddr *)&local_228,local_230,conn->local_ip,&conn->local_port
                                  );
          if (_Var8) goto LAB_0010dc95;
          fmt = "ssloc inet_ntop() failed with errno %d: %s";
        }
        else {
          fmt = "ssrem inet_ntop() failed with errno %d: %s";
        }
      }
      else {
        fmt = "getsockname() failed with errno %d: %s";
      }
    }
    else {
      fmt = "getpeername() failed with errno %d: %s";
    }
    puVar10 = (uint *)__errno_location();
    err = *puVar10;
    pcVar11 = Curl_strerror(err,local_128,0x100);
    Curl_failf(pCVar1,fmt,(ulong)err,pcVar11);
  }
  else {
LAB_0010dc95:
    pCVar1 = conn->data;
    uVar3 = *(undefined8 *)(conn->primary_ip + 0x26);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x1e) =
         *(undefined8 *)(conn->primary_ip + 0x1e);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x26) = uVar3;
    uVar3 = *(undefined8 *)(conn->primary_ip + 0x18);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x10) =
         *(undefined8 *)(conn->primary_ip + 0x10);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x18) = uVar3;
    uVar3 = *(undefined8 *)(conn->primary_ip + 8);
    *(undefined8 *)(pCVar1->info).conn_primary_ip = *(undefined8 *)conn->primary_ip;
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 8) = uVar3;
    pCVar1 = conn->data;
    uVar3 = *(undefined8 *)(conn->local_ip + 0x18);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x10) = *(undefined8 *)(conn->local_ip + 0x10);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x18) = uVar3;
    uVar3 = *(undefined8 *)(conn->local_ip + 0x26);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x1e) = *(undefined8 *)(conn->local_ip + 0x1e);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x26) = uVar3;
    uVar3 = *(undefined8 *)(conn->local_ip + 8);
    *(undefined8 *)(pCVar1->info).conn_local_ip = *(undefined8 *)conn->local_ip;
    *(undefined8 *)((pCVar1->info).conn_local_ip + 8) = uVar3;
    pCVar2 = conn->handler;
    pCVar1 = conn->data;
    (pCVar1->info).conn_scheme = pCVar2->scheme;
    (pCVar1->info).conn_protocol = pCVar2->protocol;
    (pCVar1->info).conn_primary_port = conn->primary_port;
    (pCVar1->info).conn_local_port = conn->local_port;
  }
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  if(conn->transport == TRNSPRT_TCP) {
#if defined(HAVE_GETPEERNAME) || defined(HAVE_GETSOCKNAME)
    if(!conn->bits.reuse && !conn->bits.tcp_fastopen) {
      struct Curl_easy *data = conn->data;
      char buffer[STRERROR_LEN];
      struct Curl_sockaddr_storage ssrem;
      struct Curl_sockaddr_storage ssloc;
      curl_socklen_t plen;
      curl_socklen_t slen;
#ifdef HAVE_GETPEERNAME
      plen = sizeof(struct Curl_sockaddr_storage);
      if(getpeername(sockfd, (struct sockaddr*) &ssrem, &plen)) {
        int error = SOCKERRNO;
        failf(data, "getpeername() failed with errno %d: %s",
              error, Curl_strerror(error, buffer, sizeof(buffer)));
        return;
      }
#endif
#ifdef HAVE_GETSOCKNAME
      slen = sizeof(struct Curl_sockaddr_storage);
      memset(&ssloc, 0, sizeof(ssloc));
      if(getsockname(sockfd, (struct sockaddr*) &ssloc, &slen)) {
        int error = SOCKERRNO;
        failf(data, "getsockname() failed with errno %d: %s",
              error, Curl_strerror(error, buffer, sizeof(buffer)));
        return;
      }
#endif
#ifdef HAVE_GETPEERNAME
      if(!Curl_addr2string((struct sockaddr*)&ssrem, plen,
                           conn->primary_ip, &conn->primary_port)) {
        failf(data, "ssrem inet_ntop() failed with errno %d: %s",
              errno, Curl_strerror(errno, buffer, sizeof(buffer)));
        return;
      }
      memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);
#endif
#ifdef HAVE_GETSOCKNAME
      if(!Curl_addr2string((struct sockaddr*)&ssloc, slen,
                           conn->local_ip, &conn->local_port)) {
        failf(data, "ssloc inet_ntop() failed with errno %d: %s",
              errno, Curl_strerror(errno, buffer, sizeof(buffer)));
        return;
      }
#endif
    }
#else /* !HAVE_GETSOCKNAME && !HAVE_GETPEERNAME */
    (void)sockfd; /* unused */
#endif
  } /* end of TCP-only section */

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}